

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t canXz(void)

{
  wchar_t wVar1;
  
  if (canXz::tested == L'\0') {
    canXz::tested = L'\x01';
    wVar1 = systemf("xz -V %s",redirectArgs);
    if (wVar1 == L'\0') {
      canXz::value = L'\x01';
    }
  }
  return canXz::value;
}

Assistant:

int
canXz(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("xz -V %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}